

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  char cVar1;
  undefined6 in_register_00000032;
  long *plVar2;
  
  plVar2 = (long *)CONCAT62(in_register_00000032,field_id);
  cVar1 = (**(code **)(*plVar2 + 0x20))(plVar2,(ulong)tag & 0xffffffff);
  if (cVar1 == '\0') {
    (**(code **)(*plVar2 + 0x28))(plVar2,0);
    this->_vptr_Deserializer = (_func_int **)0x0;
  }
  else {
    Read<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,duckdb::TableFilter>
              (this);
    (**(code **)(*plVar2 + 0x28))(plVar2,1);
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}